

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::IsPeriodic(ON_NurbsSurface *this,int dir)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  double *pointB;
  double *pointA;
  
  if (1 < (uint)dir) {
    return false;
  }
  bVar3 = ON_IsKnotVectorPeriodic
                    (this->m_order[(uint)dir],this->m_cv_count[(uint)dir],this->m_knot[(uint)dir]);
  if ((bVar3) && (0 < this->m_cv_count[1U - dir])) {
    uVar10 = this->m_cv_count[(uint)dir] - 1;
    uVar6 = this->m_order[(uint)dir] - 2;
    uVar8 = 0;
    do {
      uVar5 = uVar10;
      uVar9 = uVar6;
      uVar1 = uVar8;
      uVar2 = uVar8;
      if (dir == 0) {
        uVar5 = uVar8;
        uVar9 = uVar8;
        uVar1 = uVar6;
        uVar2 = uVar10;
      }
      uVar9 = uVar9 * this->m_cv_stride[1] + uVar1 * this->m_cv_stride[0];
      pointA = this->m_cv + uVar9;
      if ((int)uVar9 < 0) {
        pointA = (double *)0x0;
      }
      if (this->m_cv == (double *)0x0) {
        pointA = (double *)0x0;
      }
      if (-1 < (int)uVar6) {
        uVar9 = uVar2 * this->m_cv_stride[0] + uVar5 * this->m_cv_stride[1];
        pointB = this->m_cv + uVar9;
        if ((int)uVar9 < 0) {
          pointB = (double *)0x0;
        }
        if (this->m_cv == (double *)0x0) {
          pointB = (double *)0x0;
        }
        uVar10 = uVar10 + ~uVar6;
        iVar7 = uVar6 + 1;
        do {
          bVar4 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,pointA,pointB);
          if (!bVar4) {
            return false;
          }
          pointA = pointA + -(long)this->m_cv_stride[(uint)dir];
          pointB = pointB + -(long)this->m_cv_stride[(uint)dir];
          iVar7 = iVar7 + -1;
        } while (0 < iVar7);
        uVar6 = 0xffffffff;
      }
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < this->m_cv_count[1U - dir]);
  }
  return bVar3;
}

Assistant:

bool 
ON_NurbsSurface::IsPeriodic( int dir ) const
{
  bool bIsPeriodic = false;
  if ( dir >= 0 && dir <= 1 )
  {
    int k;
    bIsPeriodic = ON_IsKnotVectorPeriodic( m_order[dir], m_cv_count[dir], m_knot[dir] );
    if ( bIsPeriodic ) 
    {
      const double *cv0, *cv1;
      int i0 = m_order[dir]-2;
      int i1 = m_cv_count[dir]-1;
      for ( k = 0; k < m_cv_count[1-dir]; k++ )
      {
        cv0 = (dir)?CV(k,i0):CV(i0,k);
        cv1 = (dir)?CV(k,i1):CV(i1,k);
        for ( /*empty*/; i0 >= 0; i0--, i1-- ) 
        {
          if ( false == ON_PointsAreCoincident( m_dim, m_is_rat, cv0, cv1 ) )
            return false;
          cv0 -= m_cv_stride[dir];
          cv1 -= m_cv_stride[dir];      
        }
      }
    }
  }
  return bIsPeriodic;
}